

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigUInt.cpp
# Opt level: O1

int __thiscall Js::BigUInt::DivRem(BigUInt *this,BigUInt *pbi)

{
  ulong uVar1;
  uint uVar2;
  code *pcVar3;
  uint32 uVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  undefined4 *puVar8;
  ulong uVar9;
  long lVar10;
  uint32 lu2;
  uint uVar11;
  uint32 local_40;
  uint local_3c;
  uint32 luT;
  uint local_34;
  uint32 luLo;
  
  AssertValid(this,true);
  if (pbi == (BigUInt *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1c1,"(pbi)","pbi");
    if (!bVar5) goto LAB_006984ee;
    *puVar8 = 0;
  }
  AssertValid(pbi,true);
  if (this == pbi) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1c2,"(this != pbi)","this != pbi");
    if (!bVar5) goto LAB_006984ee;
    *puVar8 = 0;
  }
  uVar2 = pbi->m_clu;
  if ((int)uVar2 < this->m_clu) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                ,0x1cb,"(m_clu <= clu)","m_clu <= clu");
    if (!bVar5) goto LAB_006984ee;
    *puVar8 = 0;
  }
  uVar6 = 0;
  if ((0 < (int)uVar2) && ((int)uVar2 <= this->m_clu)) {
    uVar6 = this->m_prglu[uVar2 - 1] / (pbi->m_prglu[uVar2 - 1] + 1);
    if (9 < uVar6) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x1d1,"(wQuo >= 0 && wQuo <= 9)","wQuo >= 0 && wQuo <= 9");
      if (!bVar5) goto LAB_006984ee;
      *puVar8 = 0;
    }
    if (uVar6 != 0) {
      if (uVar6 == 1) {
        Subtract(this,pbi);
      }
      else {
        if ((int)uVar2 < 1) {
          bVar5 = true;
          uVar11 = 0;
        }
        else {
          local_34 = uVar6;
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          uVar6 = 1;
          uVar11 = 0;
          lVar10 = 0;
          lu2 = 0;
          do {
            local_3c = uVar6;
            if (1 < uVar6) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              *puVar8 = 1;
              bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                          ,0x1e0,"(wCarry == 0 || wCarry == 1)",
                                          "wCarry == 0 || wCarry == 1");
              if (!bVar5) goto LAB_006984ee;
              *puVar8 = 0;
            }
            luT = NumberUtilities::MulLu
                            (local_34,*(uint32 *)((long)pbi->m_prglu + lVar10),&local_40);
            uVar4 = local_40;
            iVar7 = NumberUtilities::AddLu(&luT,lu2);
            if ((luT != 0) || (uVar6 = local_3c, local_3c == 0)) {
              uVar6 = NumberUtilities::AddLu
                                ((uint32 *)((long)this->m_prglu + lVar10),local_3c + ~luT);
            }
            lu2 = iVar7 + uVar4;
            lVar10 = lVar10 + 4;
            uVar11 = uVar11 + 1;
          } while ((ulong)uVar2 * 4 != lVar10);
          bVar5 = uVar6 == 1;
          uVar6 = local_34;
        }
        if (!bVar5) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x1ea,"(1 == wCarry)","1 == wCarry");
          if (!bVar5) goto LAB_006984ee;
          *puVar8 = 0;
        }
        if (uVar11 != uVar2) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar8 = 1;
          bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                      ,0x1eb,"(ilu == clu)","ilu == clu");
          if (!bVar5) goto LAB_006984ee;
          *puVar8 = 0;
        }
        uVar9 = (ulong)uVar11;
        do {
          if ((long)uVar9 < 1) {
            iVar7 = 0;
            goto LAB_00698446;
          }
          uVar1 = uVar9 - 1;
          lVar10 = uVar9 - 1;
          uVar9 = uVar1;
        } while (this->m_prglu[lVar10] == 0);
        iVar7 = (int)uVar1 + 1;
LAB_00698446:
        this->m_clu = iVar7;
      }
    }
    if ((int)uVar6 < 9) {
      iVar7 = Compare(this,pbi);
      if (-1 < iVar7) {
        uVar6 = uVar6 + 1;
        if (iVar7 == 0) {
          this->m_clu = 0;
        }
        else {
          Subtract(this,pbi);
        }
      }
    }
    iVar7 = Compare(this,pbi);
    if (-1 < iVar7) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar8 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BigUInt.cpp"
                                  ,0x1fc,"(Compare(pbi) < 0)","Compare(pbi) < 0");
      if (!bVar5) {
LAB_006984ee:
        pcVar3 = (code *)invalidInstructionException();
        (*pcVar3)();
      }
      *puVar8 = 0;
    }
  }
  return uVar6;
}

Assistant:

int BigUInt::DivRem(BigUInt *pbi)
    {
        AssertBi(this);
        AssertBi(pbi);
        Assert(this != pbi);

        int32 ilu, clu;
        int wCarry;
        int wQuo;
        int wT;
        uint32 luT, luHi, luLo;

        clu = pbi->m_clu;
        Assert(m_clu <= clu);
        if ((m_clu < clu) || (clu <= 0))
            return 0;

        // Get a lower bound on the quotient.
        wQuo = (int)(m_prglu[clu - 1] / (pbi->m_prglu[clu - 1] + 1));
        Assert(wQuo >= 0 && wQuo <= 9);

        // Handle 0 and 1 as special cases.
        switch (wQuo)
        {
        case 0:
            break;
        case 1:
            Subtract(pbi);
            break;
        default:
            luHi = 0;
            wCarry = 1;
            for (ilu = 0; ilu < clu; ilu++)
            {
                Assert(wCarry == 0 || wCarry == 1);

                // Compute the product.
                luLo = NumberUtilities::MulLu(wQuo, pbi->m_prglu[ilu], &luT);
                luHi = luT + NumberUtilities::AddLu(&luLo, luHi);

                // Subtract the product. See note in BigInt::Subtract.
                if (0 != luLo || 0 == wCarry)
                    wCarry = NumberUtilities::AddLu(&m_prglu[ilu], ~luLo + wCarry);
            }
            Assert(1 == wCarry);
            Assert(ilu == clu);

            // Trim off zeros.
            while (--ilu >= 0 && 0 == m_prglu[ilu])
                ;
            m_clu = ilu + 1;
        }

        if (wQuo < 9 && (wT = Compare(pbi)) >= 0)
        {
            // Quotient was off too small (by one).
            wQuo++;
            if (wT == 0)
                m_clu = 0;
            else
                Subtract(pbi);
        }
        Assert(Compare(pbi) < 0);

        return wQuo;
    }